

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

counting_iterator
fmt::v7::detail::write_exponent<char,fmt::v7::detail::counting_iterator>
          (int exp,counting_iterator it)

{
  uint uVar1;
  long lVar2;
  
  if (exp + 9999U < 19999) {
    uVar1 = -exp;
    if (0 < exp) {
      uVar1 = exp;
    }
    lVar2 = it.count_ + 2;
    if (uVar1 < 1000) {
      lVar2 = it.count_ + 1;
    }
    lVar2 = lVar2 + 1;
    if (uVar1 < 100) {
      lVar2 = it.count_ + 1;
    }
    return (counting_iterator)(lVar2 + 2);
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
              ,0x452,"exponent out of range");
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}